

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> *
NpyArray::CreateHeaderNPY
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,shape_t *shape,char type,
          size_t wordSize)

{
  bool bVar1;
  int iVar2;
  vector<char,std::allocator<char>> *lhs;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  size_type __n;
  char cVar8;
  ulong uVar9;
  vector<char,_std::allocator<char>_> dict;
  vector<char,_std::allocator<char>_> *header;
  string __str_2;
  string __str_1;
  string __str;
  value_type local_b9;
  vector<char,_std::allocator<char>_> local_b8;
  vector<char,std::allocator<char>> *local_98;
  char *local_90;
  uint local_88;
  undefined4 uStack_84;
  char local_80 [16];
  char *local_70;
  uint local_68;
  undefined4 uStack_64;
  char local_60 [16];
  char *local_50;
  uint local_48;
  undefined4 uStack_44;
  char local_40 [16];
  
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98 = (vector<char,std::allocator<char>> *)__return_storage_ptr__;
  add(&local_b8,"{\'descr\': \'");
  add<char>(&local_b8,'<');
  add<char>(&local_b8,type);
  cVar8 = '\x01';
  if (9 < wordSize) {
    sVar4 = wordSize;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (sVar4 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00117a18;
      }
      if (sVar4 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00117a18;
      }
      if (sVar4 < 10000) goto LAB_00117a18;
      bVar1 = 99999 < sVar4;
      sVar4 = sVar4 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_00117a18:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,wordSize);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)&local_b8,
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_50,local_50 + CONCAT44(uStack_44,local_48));
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  add(&local_b8,"\', \'fortran_order\': False, \'shape\': (");
  uVar9 = *(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  cVar8 = '\x01';
  if (9 < uVar9) {
    uVar5 = uVar9;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar5 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00117ae4;
      }
      if (uVar5 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00117ae4;
      }
      if (uVar5 < 10000) goto LAB_00117ae4;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar1);
    cVar8 = cVar8 + '\x01';
  }
LAB_00117ae4:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_70,local_68,uVar9);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)&local_b8,
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_70,local_70 + CONCAT44(uStack_64,local_68));
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (8 < (ulong)((long)(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
    uVar9 = 1;
    do {
      add(&local_b8,", ");
      uVar5 = (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      cVar8 = '\x01';
      if (9 < uVar5) {
        uVar6 = uVar5;
        cVar3 = '\x04';
        do {
          cVar8 = cVar3;
          if (uVar6 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_00117bc7;
          }
          if (uVar6 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_00117bc7;
          }
          if (uVar6 < 10000) goto LAB_00117bc7;
          bVar1 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar3 = cVar8 + '\x04';
        } while (bVar1);
        cVar8 = cVar8 + '\x01';
      }
LAB_00117bc7:
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar8);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_90,local_88,uVar5);
      std::vector<char,std::allocator<char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<char,std::allocator<char>> *)&local_b8,
                 local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_90,local_90 + CONCAT44(uStack_84,local_88))
      ;
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(shape->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(shape->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  add(&local_b8,"), }");
  iVar2 = (int)((long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  sVar7 = 0x10 - (ulong)(iVar2 + 10U & 0xf);
  uVar9 = ((long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start) + sVar7;
  __n = 0x10 - (ulong)(iVar2 + 0xcU & 0xf);
  if (uVar9 < 0x10000) {
    __n = sVar7;
  }
  local_b9 = ' ';
  std::vector<char,_std::allocator<char>_>::_M_fill_insert
            (&local_b8,
             (iterator)
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,__n,&local_b9);
  lhs = local_98;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
  [-1] = '\n';
  *(undefined8 *)local_98 = 0;
  *(undefined8 *)(local_98 + 8) = 0;
  *(undefined8 *)(local_98 + 0x10) = 0;
  add<char>((vector<char,_std::allocator<char>_> *)local_98,-0x6d);
  add((vector<char,_std::allocator<char>_> *)lhs,"NUMPY");
  add<char>((vector<char,_std::allocator<char>_> *)lhs,'\x02' - (uVar9 < 0x10000));
  add<char>((vector<char,_std::allocator<char>_> *)lhs,'\0');
  if (uVar9 < 0x10000) {
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)lhs,
                        (unsigned_short)
                        ((long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start));
  }
  else {
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)lhs,
                      (uint)((long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start));
  }
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            (lhs,*(undefined8 *)(lhs + 8),
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (vector<char,_std::allocator<char>_> *)lhs;
}

Assistant:

std::vector<char> NpyArray::CreateHeaderNPY(const shape_t& shape, char type, size_t wordSize)
{
	std::vector<char> dict;
	add(dict, "{'descr': '");
	#if __BYTE_ORDER == __LITTLE_ENDIAN
	add(dict, '<');
	#else
	add(dict, '>');
	#endif
	add(dict, type);
	add(dict, std::to_string(wordSize));
	add(dict, "', 'fortran_order': False, 'shape': (");
	add(dict, std::to_string(shape[0]));
	for (size_t i = 1; i < shape.size(); i++) {
		add(dict, ", ");
		add(dict, std::to_string(shape[i]));
	}
	add(dict, "), }");
	// pad with spaces so that preamble+dict is modulo 16 bytes
	// preamble is 10/12 bytes and dict needs to end with \n
	char ver = 1;
	size_t remainder = 16 - (10 + dict.size()) % 16;
	if (dict.size() + remainder > 65535) {
		ver = 2;
		remainder = 16 - (12 + dict.size()) % 16;
	}
	dict.insert(dict.end(), remainder, ' ');
	dict.back() = '\n';

	std::vector<char> header;
	add(header, (char)0x93);
	add(header, "NUMPY");
	add(header, ver); // major version of numpy format
	add(header, (char)0); // minor version of numpy format
	if (ver == 1)
		add(header, (uint16_t)dict.size());
	else
		add(header, (uint32_t)dict.size());
	header.insert(header.end(), dict.begin(), dict.end());
	return header;
}